

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall tetgenio::load_vtk(tetgenio *this,char *filebasename)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *result;
  size_t sVar5;
  FILE *__stream;
  byte *pbVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  facet *pfVar10;
  long lVar11;
  polygon *ppVar12;
  int *piVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  bool bVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  double *__ptr;
  long lVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  float *pfVar24;
  int *__ptr_00;
  tetgenio *ptVar25;
  double dVar26;
  int nverts;
  int nn;
  int id3;
  int id2;
  int nfaces;
  int id1;
  float _z;
  float _y;
  float _x;
  int dummy;
  char mode [128];
  char fmt [64];
  char id [256];
  char infilename [1024];
  char line [2048];
  long local_e70;
  byte *local_e68;
  uint local_e60;
  int local_e5c;
  int local_e58;
  int local_e54;
  uint local_e50;
  int local_e4c;
  float local_e48;
  float local_e44;
  long local_e40;
  float local_e34;
  tetgenio *local_e30;
  long local_e28;
  long local_e20;
  long local_e18;
  long local_e10;
  long local_e08;
  undefined1 local_dfc [4];
  undefined4 local_df8;
  short local_df4;
  undefined1 uStack_df2;
  undefined4 local_d78;
  short local_d74;
  undefined1 uStack_d72;
  undefined4 local_d38;
  short sStack_d34;
  undefined1 uStack_d32;
  undefined1 uStack_d31;
  char local_d30;
  char acStack_c3c [4];
  char local_c38 [4];
  undefined1 auStack_c34 [1019];
  undefined1 local_839;
  byte local_838 [2056];
  
  local_e60 = 0;
  local_e50 = 0;
  local_e5c = -1;
  strncpy(local_c38,filebasename,0x3ff);
  local_839 = 0;
  if (local_c38[0] == '\0') {
    pcVar18 = "Error:  No filename.";
    goto LAB_0010caa4;
  }
  sVar5 = strlen(local_c38);
  iVar4 = strcmp(acStack_c3c + sVar5,".vtk");
  if (iVar4 != 0) {
    sVar5 = strlen(local_c38);
    builtin_strncpy(local_c38 + sVar5,".vtk",4);
    auStack_c34[sVar5] = 0;
  }
  __stream = fopen(local_c38,"r");
  if (__stream == (FILE *)0x0) {
    printf("Error:  Unable to open file %s\n",local_c38);
    return false;
  }
  printf("Opening %s.\n",local_c38);
  this->firstnumber = 0;
  local_df8 = 0x414e4942;
  local_df4 = 0x5952;
  uStack_df2 = 0;
  uVar21 = 0;
  uVar22 = 0;
  local_e30 = this;
LAB_0010c4d5:
  pbVar6 = (byte *)fgets((char *)local_838,0x7ff,__stream);
  while (uVar21 = uVar21 + 1, pbVar6 != (byte *)0x0) {
    while( true ) {
      uVar7 = (ulong)*pbVar6;
      if (0x20 < uVar7) goto LAB_0010c52f;
      if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) break;
      pbVar6 = pbVar6 + 1;
    }
    if ((0x2401UL >> (uVar7 & 0x3f) & 1) == 0) goto LAB_0010c52f;
    pbVar6 = (byte *)fgets((char *)local_838,0x7ff,__stream);
  }
  pbVar6 = (byte *)0x0;
LAB_0010c52f:
  if (pbVar6 != (byte *)0x0) {
    if ((0x23 < (ulong)local_838[0]) || ((0x900002401U >> ((ulong)local_838[0] & 0x3f) & 1) == 0)) {
      __isoc99_sscanf(local_838,"%s",&local_d38);
      if (sStack_d34 == 0x49 && local_d38 == 0x49435341) {
        local_df4 = 0x49;
        local_df8 = 0x49435341;
      }
      if (CONCAT13(uStack_d32,CONCAT21(sStack_d34,local_d38._3_1_)) == 0x53544e &&
          local_d38 == 0x4e494f50) {
        local_e68 = pbVar6;
        __isoc99_sscanf(local_838,"%s %d %s",&local_d38,&local_e60,&local_d78);
        ptVar25 = local_e30;
        uVar3 = local_e60;
        if (0 < (int)local_e60) {
          local_e30->numberofpoints = local_e60;
          pdVar8 = (double *)operator_new__((ulong)local_e60 * 0x18);
          ptVar25->pointlist = pdVar8;
          uVar22 = uVar3 + 1;
        }
        if (CONCAT13(uStack_df2,CONCAT21(local_df4,local_df8._3_1_)) == 0x595241 &&
            local_df8 == 0x414e4942) {
          if (0 < (int)local_e60) {
            lVar11 = 8;
            lVar19 = 0xf;
            lVar17 = 0x10;
            lVar23 = 0x17;
            lVar20 = 0;
            lVar9 = 0;
            do {
              pdVar8 = local_e30->pointlist;
              __ptr = pdVar8 + lVar9 * 3;
              local_e40 = lVar11;
              local_e28 = lVar23;
              local_e20 = lVar17;
              local_e18 = lVar19;
              local_e10 = lVar20;
              local_e08 = lVar9;
              if (CONCAT13(uStack_d72,CONCAT21(local_d74,local_d78._3_1_)) == 0x656c62 &&
                  local_d78 == 0x62756f64) {
                fread(__ptr,8,1,__stream);
                fread(__ptr + 1,8,1,__stream);
                fread(__ptr + 2,8,1,__stream);
                puVar14 = (undefined1 *)(local_e10 + (long)pdVar8);
                lVar11 = 7;
                puVar15 = puVar14;
                do {
                  uVar1 = *puVar15;
                  *puVar15 = puVar14[lVar11];
                  puVar14[lVar11] = uVar1;
                  lVar11 = lVar11 + -1;
                  puVar15 = puVar15 + 1;
                } while (lVar11 != 3);
                puVar14 = (undefined1 *)(local_e18 + (long)pdVar8);
                lVar11 = 0;
                do {
                  uVar1 = *(undefined1 *)((long)pdVar8 + lVar11 + local_e40);
                  *(undefined1 *)((long)pdVar8 + lVar11 + local_e40) = *puVar14;
                  *puVar14 = uVar1;
                  lVar11 = lVar11 + 1;
                  puVar14 = puVar14 + -1;
                } while (lVar11 != 4);
                puVar14 = (undefined1 *)((long)pdVar8 + local_e28);
                lVar9 = 0;
                do {
                  uVar1 = *(undefined1 *)((long)pdVar8 + lVar9 + local_e20);
                  *(undefined1 *)((long)pdVar8 + lVar9 + local_e20) = *puVar14;
                  *puVar14 = uVar1;
                  lVar9 = lVar9 + 1;
                  puVar14 = puVar14 + -1;
                  lVar17 = local_e20;
                  lVar11 = local_e40;
                  lVar19 = local_e18;
                  lVar23 = local_e28;
                  lVar20 = local_e10;
                } while (lVar9 != 4);
              }
              else {
                if (local_d74 != 0x74 || local_d78 != 0x616f6c66) {
                  pcVar18 = "Error: Only float or double formats are supported!";
                  goto LAB_0010caa4;
                }
                pfVar24 = &local_e34;
                fread(pfVar24,4,1,__stream);
                fread(&local_e44,4,1,__stream);
                fread(&local_e48,4,1,__stream);
                lVar11 = local_e40;
                lVar9 = 3;
                do {
                  uVar1 = *(undefined1 *)pfVar24;
                  *(undefined1 *)pfVar24 = *(undefined1 *)((long)&local_e34 + lVar9);
                  lVar20 = local_e10;
                  lVar19 = local_e18;
                  lVar17 = local_e20;
                  lVar23 = local_e28;
                  *(undefined1 *)((long)&local_e34 + lVar9) = uVar1;
                  lVar9 = lVar9 + -1;
                  pfVar24 = (float *)((long)pfVar24 + 1);
                } while (lVar9 != 1);
                lVar9 = 3;
                pfVar24 = &local_e44;
                do {
                  uVar1 = *(undefined1 *)pfVar24;
                  *(undefined1 *)pfVar24 = *(undefined1 *)((long)&local_e44 + lVar9);
                  *(undefined1 *)((long)&local_e44 + lVar9) = uVar1;
                  lVar9 = lVar9 + -1;
                  pfVar24 = (float *)((long)pfVar24 + 1);
                } while (lVar9 != 1);
                lVar9 = 3;
                pfVar24 = &local_e48;
                do {
                  uVar1 = *(undefined1 *)pfVar24;
                  *(undefined1 *)pfVar24 = *(undefined1 *)((long)&local_e48 + lVar9);
                  *(undefined1 *)((long)&local_e48 + lVar9) = uVar1;
                  lVar9 = lVar9 + -1;
                  pfVar24 = (float *)((long)pfVar24 + 1);
                } while (lVar9 != 1);
                *__ptr = (double)local_e34;
                __ptr[1] = (double)local_e44;
                __ptr[2] = (double)local_e48;
              }
              lVar9 = local_e08 + 1;
              lVar20 = lVar20 + 0x18;
              lVar11 = lVar11 + 0x18;
              lVar19 = lVar19 + 0x18;
              lVar17 = lVar17 + 0x18;
              lVar23 = lVar23 + 0x18;
            } while (lVar9 < (int)local_e60);
          }
        }
        else if ((local_df4 == 0x49 && local_df8 == 0x49435341) && (0 < (int)local_e60)) {
          lVar11 = 0;
LAB_0010c6e6:
          do {
            pbVar6 = (byte *)fgets((char *)local_838,0x7ff,__stream);
            uVar21 = uVar21 + 1;
            if (pbVar6 == (byte *)0x0) {
              pbVar6 = (byte *)0x0;
            }
            else {
              for (; uVar7 = (ulong)*pbVar6, uVar7 < 0x21; pbVar6 = pbVar6 + 1) {
                if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) {
                  if ((0x2401UL >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0010c6e6;
                  break;
                }
              }
            }
            local_e68 = pbVar6;
            if (pbVar6 == (byte *)0x0) {
              pcVar18 = "Unexpected end of file on line %d in file %s\n";
LAB_0010d011:
              printf(pcVar18,(ulong)uVar21,local_c38);
              fclose(__stream);
              return false;
            }
            pdVar8 = local_e30->pointlist;
            lVar23 = 0;
            local_e40 = lVar11;
            do {
              if (*local_e68 == 0) {
                printf("Syntax error reading vertex coords on line");
                pcVar18 = " %d in file %s\n";
                goto LAB_0010d011;
              }
              dVar26 = strtod((char *)local_e68,(char **)&local_e68);
              pdVar8[lVar11 * 3 + lVar23] = dVar26;
              while ((0x2c < (ulong)*local_e68 ||
                     ((0x100900000201U >> ((ulong)*local_e68 & 0x3f) & 1) == 0))) {
                local_e68 = local_e68 + 1;
              }
LAB_0010c7a7:
              uVar7 = (ulong)*local_e68;
              if (0x2e < uVar7) {
LAB_0010c7bc:
                if (0xf5 < (byte)(*local_e68 - 0x3a)) goto LAB_0010c7c9;
                local_e68 = local_e68 + 1;
                goto LAB_0010c7a7;
              }
              if ((0x680000000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0010c7c9;
              if (uVar7 != 0x23) goto LAB_0010c7bc;
              *local_e68 = 0;
LAB_0010c7c9:
              lVar23 = lVar23 + 1;
            } while (lVar23 != 3);
            lVar11 = local_e40 + 1;
          } while (lVar11 < (int)local_e60);
        }
      }
      else {
        if (local_d30 == '\0' &&
            CONCAT17(uStack_d31,CONCAT16(uStack_d32,CONCAT24(sStack_d34,local_d38))) ==
            0x534e4f47594c4f50) {
          local_e68 = pbVar6;
          __isoc99_sscanf(local_838,"%s %d  %d",&local_d38,&local_e50,local_dfc);
          ptVar25 = local_e30;
          if (0 < (long)(int)local_e50) {
            local_e30->numberoffacets = local_e50;
            pfVar10 = (facet *)operator_new__((long)(int)local_e50 << 5);
            ptVar25->facetlist = pfVar10;
          }
          if (CONCAT13(uStack_df2,CONCAT21(local_df4,local_df8._3_1_)) == 0x595241 &&
              local_df8 == 0x414e4942) {
            if ((int)local_e50 < 1) goto LAB_0010cfc6;
            local_e70 = 0;
            iVar4 = -1;
            goto LAB_0010ce16;
          }
          if ((local_df4 != 0x49 || local_df8 != 0x49435341) || ((int)local_e50 < 1))
          goto LAB_0010cfc6;
          local_e70 = 0;
          iVar4 = -1;
          goto LAB_0010cb97;
        }
        if ((sStack_d34 == 0x53 && local_d38 == 0x454e494c) ||
           (sStack_d34 == 0x53 && local_d38 == 0x4c4c4543)) {
          puts("Warning:  load_vtk(): cannot read formats LINES, CELLS.");
        }
      }
    }
    goto LAB_0010c4d5;
  }
  goto LAB_0010cab2;
  while( true ) {
    piVar13 = &local_e4c;
    fread(piVar13,4,1,__stream);
    fread(__ptr_00,4,1,__stream);
    fread(&local_e58,4,1,__stream);
    lVar11 = 3;
    do {
      iVar2 = *piVar13;
      *(undefined1 *)piVar13 = *(undefined1 *)((long)&local_e4c + lVar11);
      *(char *)((long)&local_e4c + lVar11) = (char)iVar2;
      lVar11 = lVar11 + -1;
      piVar13 = (int *)((long)piVar13 + 1);
    } while (lVar11 != 1);
    lVar11 = 3;
    do {
      iVar2 = *__ptr_00;
      *(undefined1 *)__ptr_00 = *(undefined1 *)((long)&local_e54 + lVar11);
      *(char *)((long)&local_e54 + lVar11) = (char)iVar2;
      lVar11 = lVar11 + -1;
      __ptr_00 = (int *)((long)__ptr_00 + 1);
    } while (lVar11 != 1);
    local_e40 = CONCAT44(local_e40._4_4_,iVar4);
    lVar11 = 3;
    piVar13 = &local_e58;
    do {
      iVar4 = *piVar13;
      *(undefined1 *)piVar13 = *(undefined1 *)((long)&local_e58 + lVar11);
      *(char *)((long)&local_e58 + lVar11) = (char)iVar4;
      lVar11 = lVar11 + -1;
      piVar13 = (int *)((long)piVar13 + 1);
    } while (lVar11 != 1);
    pfVar10 = ptVar25->facetlist;
    pfVar10[local_e70].polygonlist = (polygon *)0x0;
    pfVar10[local_e70].holelist = (double *)0x0;
    pfVar10[local_e70].numberofholes = 0;
    pfVar10[local_e70].numberofpolygons = 1;
    ppVar12 = (polygon *)operator_new__(0x10);
    pfVar10[local_e70].polygonlist = ppVar12;
    ppVar12->vertexlist = (int *)0x0;
    ppVar12->numberofvertices = 3;
    piVar13 = (int *)operator_new__(0xc);
    ppVar12->vertexlist = piVar13;
    *piVar13 = local_e4c;
    piVar13[1] = local_e54;
    piVar13[2] = local_e58;
    lVar11 = 0;
    do {
      if (piVar13[lVar11] < (int)uVar22) {
        uVar22 = piVar13[lVar11];
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    local_e70 = local_e70 + 1;
    ptVar25 = local_e30;
    iVar4 = (int)local_e40;
    if ((int)local_e50 <= local_e70) break;
LAB_0010ce16:
    __ptr_00 = &local_e54;
    piVar13 = &local_e5c;
    fread(piVar13,4,1,__stream);
    lVar11 = 3;
    do {
      iVar2 = *piVar13;
      *(undefined1 *)piVar13 = *(undefined1 *)((long)&local_e5c + lVar11);
      *(char *)((long)&local_e5c + lVar11) = (char)iVar2;
      lVar11 = lVar11 + -1;
      piVar13 = (int *)((long)piVar13 + 1);
    } while (lVar11 != 1);
    if (local_e70 == 0) {
      iVar4 = local_e5c;
    }
    if (local_e5c != iVar4) goto LAB_0010d030;
    if (local_e5c != 3) {
      pcVar18 = "Error: Only triangles are supported";
      goto LAB_0010caa4;
    }
  }
  goto LAB_0010cfc6;
LAB_0010d030:
  pcVar18 = "Error:  No mixed cells are allowed.";
LAB_0010caa4:
  puts(pcVar18);
  return false;
LAB_0010cb97:
  do {
    pbVar6 = (byte *)fgets((char *)local_838,0x7ff,__stream);
    if (pbVar6 == (byte *)0x0) {
      pbVar6 = (byte *)0x0;
    }
    else {
      for (; uVar7 = (ulong)*pbVar6, uVar7 < 0x21; pbVar6 = pbVar6 + 1) {
        if ((0x2401UL >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0010cb97;
        if ((0x100000200U >> (uVar7 & 0x3f) & 1) == 0) break;
      }
    }
    local_e68 = pbVar6;
    lVar11 = strtol((char *)pbVar6,(char **)&local_e68,0);
    local_e5c = (int)lVar11;
    if (local_e70 == 0) {
      iVar4 = local_e5c;
    }
    if (iVar4 != local_e5c) goto LAB_0010d030;
    if (local_e5c != 3) {
      pcVar18 = "Error:  Only triangles are supported.";
      goto LAB_0010caa4;
    }
    while ((0x2c < (ulong)*local_e68 || ((0x100900000201U >> ((ulong)*local_e68 & 0x3f) & 1) == 0)))
    {
      local_e68 = local_e68 + 1;
    }
LAB_0010cc34:
    uVar7 = (ulong)*local_e68;
    if (0x2e < uVar7) {
LAB_0010cc49:
      if (0xf5 < (byte)(*local_e68 - 0x3a)) goto LAB_0010cc54;
      local_e68 = local_e68 + 1;
      goto LAB_0010cc34;
    }
    if ((0x680000000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0010cc54;
    if (uVar7 != 0x23) goto LAB_0010cc49;
    *local_e68 = 0;
LAB_0010cc54:
    local_e18 = strtol((char *)local_e68,(char **)&local_e68,0);
    local_e4c = (int)local_e18;
    while ((0x2c < (ulong)*local_e68 || ((0x100900000201U >> ((ulong)*local_e68 & 0x3f) & 1) == 0)))
    {
      local_e68 = local_e68 + 1;
    }
LAB_0010cc99:
    uVar7 = (ulong)*local_e68;
    if (0x2e < uVar7) {
LAB_0010ccae:
      if (0xf5 < (byte)(*local_e68 - 0x3a)) goto LAB_0010ccbc;
      local_e68 = local_e68 + 1;
      goto LAB_0010cc99;
    }
    if ((0x680000000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0010ccbc;
    if (uVar7 != 0x23) goto LAB_0010ccae;
    *local_e68 = 0;
LAB_0010ccbc:
    local_e20 = strtol((char *)local_e68,(char **)&local_e68,0);
    local_e54 = (int)local_e20;
    while ((0x2c < (ulong)*local_e68 || ((0x100900000201U >> ((ulong)*local_e68 & 0x3f) & 1) == 0)))
    {
      local_e68 = local_e68 + 1;
    }
LAB_0010cd01:
    uVar7 = (ulong)*local_e68;
    if (0x2e < uVar7) {
LAB_0010cd16:
      if (0xf5 < (byte)(*local_e68 - 0x3a)) goto LAB_0010cd24;
      local_e68 = local_e68 + 1;
      goto LAB_0010cd01;
    }
    if ((0x680000000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0010cd24;
    if (uVar7 != 0x23) goto LAB_0010cd16;
    *local_e68 = 0;
LAB_0010cd24:
    local_e40 = CONCAT44(local_e40._4_4_,iVar4);
    local_e28 = strtol((char *)local_e68,(char **)&local_e68,0);
    local_e58 = (int)local_e28;
    pfVar10 = ptVar25->facetlist;
    pfVar10[local_e70].polygonlist = (polygon *)0x0;
    pfVar10[local_e70].holelist = (double *)0x0;
    pfVar10[local_e70].numberofholes = 0;
    pfVar10[local_e70].numberofpolygons = 1;
    ppVar12 = (polygon *)operator_new__(0x10);
    pfVar10[local_e70].polygonlist = ppVar12;
    ppVar12->vertexlist = (int *)0x0;
    ppVar12->numberofvertices = 3;
    piVar13 = (int *)operator_new__(0xc);
    ppVar12->vertexlist = piVar13;
    *piVar13 = (int)local_e18;
    piVar13[1] = (int)local_e20;
    piVar13[2] = (int)local_e28;
    lVar11 = 0;
    do {
      if (piVar13[lVar11] < (int)uVar22) {
        uVar22 = piVar13[lVar11];
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
    local_e70 = local_e70 + 1;
    ptVar25 = local_e30;
    iVar4 = (int)local_e40;
  } while (local_e70 < (int)local_e50);
LAB_0010cfc6:
  fclose(__stream);
  if (uVar22 < 2) {
    ptVar25->firstnumber = uVar22;
LAB_0010cab2:
    bVar16 = true;
  }
  else {
    bVar16 = false;
    printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)uVar22,local_c38);
  }
  return bVar16;
}

Assistant:

bool tetgenio::load_vtk(char* filebasename)
{
  FILE *fp;
  tetgenio::facet *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char line[INPUTLINESIZE];
  char mode[128], id[256], fmt[64];
  char *bufferp;
  double *coord;
  float _x, _y, _z;
  int nverts = 0;
  int nfaces = 0;
  int line_count = 0;
  int dummy;
  int id1, id2, id3;
  int nn = -1;
  int nn_old = -1;
  int i, j;
  bool ImALittleEndian = !testIsBigEndian();

  int smallestidx = 0;

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 4], ".vtk") != 0) {
    strcat(infilename, ".vtk");
  }
  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  // Default uses the index starts from '0'.
  firstnumber = 0;
  strcpy(mode, "BINARY");

  while((bufferp = readline(line, fp, &line_count)) != NULL) {
    if(strlen(line) == 0) continue;
    //swallow lines beginning with a comment sign or white space
    if(line[0] == '#' || line[0]=='\n' || line[0] == 10 || line[0] == 13 || 
       line[0] == 32) continue;

    sscanf(line, "%s", id);
    if(!strcmp(id, "ASCII")) {
      strcpy(mode, "ASCII");
    }

    if(!strcmp(id, "POINTS")) {
      sscanf(line, "%s %d %s", id, &nverts, fmt);
      if (nverts > 0) {
        numberofpoints = nverts;
        pointlist = new REAL[nverts * 3];
        smallestidx = nverts + 1;
      }

      if(!strcmp(mode, "BINARY")) {
        for(i = 0; i < nverts; i++) {
          coord = &pointlist[i * 3];
          if(!strcmp(fmt, "double")) {
            fread((char*)(&(coord[0])), sizeof(double), 1, fp);
            fread((char*)(&(coord[1])), sizeof(double), 1, fp);
            fread((char*)(&(coord[2])), sizeof(double), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &(coord[0]), sizeof(coord[0]));
              swapBytes((unsigned char *) &(coord[1]), sizeof(coord[1]));
              swapBytes((unsigned char *) &(coord[2]), sizeof(coord[2]));
            }
          } else if(!strcmp(fmt, "float")) {
            fread((char*)(&_x), sizeof(float), 1, fp);
            fread((char*)(&_y), sizeof(float), 1, fp);
            fread((char*)(&_z), sizeof(float), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &_x, sizeof(_x));
              swapBytes((unsigned char *) &_y, sizeof(_y));
              swapBytes((unsigned char *) &_z, sizeof(_z));
            }
            coord[0] = double(_x);
            coord[1] = double(_y);
            coord[2] = double(_z);
          } else {
            printf("Error: Only float or double formats are supported!\n");
            return false;
          }
        }
      } else if(!strcmp(mode, "ASCII")) {
        for(i = 0; i < nverts; i++){
          bufferp = readline(line, fp, &line_count);
          if (bufferp == NULL) {
            printf("Unexpected end of file on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          // Read vertex coordinates
          coord = &pointlist[i * 3];
          for (j = 0; j < 3; j++) {
            if (*bufferp == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n", line_count, infilename);
              fclose(fp);
              return false;
            }
            coord[j] = (REAL) strtod(bufferp, &bufferp);
            bufferp = findnextnumber(bufferp);
          }
        }
      }
      continue;
    }

    if(!strcmp(id, "POLYGONS")) {
      sscanf(line, "%s %d  %d", id, &nfaces, &dummy);
      if (nfaces > 0) {
        numberoffacets = nfaces;
        facetlist = new tetgenio::facet[nfaces];
      }

      if(!strcmp(mode, "BINARY")) {
        for(i = 0; i < nfaces; i++){
          fread((char*)(&nn), sizeof(int), 1, fp);
          if(ImALittleEndian){
            swapBytes((unsigned char *) &nn, sizeof(nn));
          }
          if (i == 0)
            nn_old = nn;
          if (nn != nn_old) {
            printf("Error:  No mixed cells are allowed.\n");
            return false;
          }

          if(nn == 3){
            fread((char*)(&id1), sizeof(int), 1, fp);
            fread((char*)(&id2), sizeof(int), 1, fp);
            fread((char*)(&id3), sizeof(int), 1, fp);
            if(ImALittleEndian){
              swapBytes((unsigned char *) &id1, sizeof(id1));
              swapBytes((unsigned char *) &id2, sizeof(id2));
              swapBytes((unsigned char *) &id3, sizeof(id3));
            }
            f = &facetlist[i];
            init(f);
            // In .off format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            init(p);
            // Set number of vertices
            p->numberofvertices = 3;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            p->vertexlist[0] = id1;
            p->vertexlist[1] = id2;
            p->vertexlist[2] = id3;
            // Detect the smallest index.
            for (j = 0; j < 3; j++) {
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
            }
          } else {
            printf("Error: Only triangles are supported\n");
            return false;
          }
        }
      } else if(!strcmp(mode, "ASCII")) {
        for(i = 0; i < nfaces; i++) {
          bufferp = readline(line, fp, &line_count);
          nn = (int) strtol(bufferp, &bufferp, 0);
          if (i == 0)
            nn_old = nn;
          if (nn != nn_old) {
            printf("Error:  No mixed cells are allowed.\n");
            return false;
          }

          if (nn == 3) {
            bufferp = findnextnumber(bufferp); // Skip the first field.
            id1 = (int) strtol(bufferp, &bufferp, 0);
            bufferp = findnextnumber(bufferp);
            id2 = (int) strtol(bufferp, &bufferp, 0);
            bufferp = findnextnumber(bufferp);
            id3 = (int) strtol(bufferp, &bufferp, 0);
            f = &facetlist[i];
            init(f);
            // In .off format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            init(p);
            // Set number of vertices
            p->numberofvertices = 3;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            p->vertexlist[0] = id1;
            p->vertexlist[1] = id2;
            p->vertexlist[2] = id3;
            // Detect the smallest index.
            for (j = 0; j < 3; j++) {
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
            }
          } else {
            printf("Error:  Only triangles are supported.\n");
            return false;
          }
        }
      }

      fclose(fp);

      // Decide the firstnumber of the index.
      if (smallestidx == 0) {
        firstnumber = 0;  
      } else if (smallestidx == 1) {
        firstnumber = 1;
      } else {
        printf("A wrong smallest index (%d) was detected in file %s\n",
               smallestidx, infilename);
        return false;
      }

      return true;
    }

    if(!strcmp(id,"LINES") || !strcmp(id,"CELLS")){
      printf("Warning:  load_vtk(): cannot read formats LINES, CELLS.\n");
    }
  } // while ()

  return true;
}